

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__cleanup_jpeg(stbi__jpeg *j)

{
  long lVar1;
  short **ppsVar2;
  
  if (0 < j->s->img_n) {
    ppsVar2 = &j->img_comp[0].coeff;
    lVar1 = 0;
    do {
      if (ppsVar2[-3] != (short *)0x0) {
        free(ppsVar2[-3]);
        ppsVar2[-4] = (short *)0x0;
        ppsVar2[-3] = (short *)0x0;
      }
      if (ppsVar2[-2] != (short *)0x0) {
        free(ppsVar2[-2]);
        ppsVar2[-2] = (short *)0x0;
        *ppsVar2 = (short *)0x0;
      }
      if (ppsVar2[-1] != (short *)0x0) {
        free(ppsVar2[-1]);
        ppsVar2[-1] = (short *)0x0;
      }
      lVar1 = lVar1 + 1;
      ppsVar2 = ppsVar2 + 0xc;
    } while (lVar1 < j->s->img_n);
  }
  return;
}

Assistant:

static void stbi__cleanup_jpeg(stbi__jpeg *j)
{
   int i;
   for (i=0; i < j->s->img_n; ++i) {
      if (j->img_comp[i].raw_data) {
         STBI_FREE(j->img_comp[i].raw_data);
         j->img_comp[i].raw_data = NULL;
         j->img_comp[i].data = NULL;
      }
      if (j->img_comp[i].raw_coeff) {
         STBI_FREE(j->img_comp[i].raw_coeff);
         j->img_comp[i].raw_coeff = 0;
         j->img_comp[i].coeff = 0;
      }
      if (j->img_comp[i].linebuf) {
         STBI_FREE(j->img_comp[i].linebuf);
         j->img_comp[i].linebuf = NULL;
      }
   }
}